

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<double>::RemoveLast(RepeatedField<double> *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  LongSooRep *this_00;
  int *piVar6;
  int *__src;
  string *psVar7;
  LongSooRep *pLVar8;
  bool bVar9;
  LongSooRep LStack_68;
  RepeatedField<double> *pRStack_58;
  LongSooRep local_30;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar3 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (iVar3 < 1) {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,0,"old_size > 0");
  }
  else {
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    bVar9 = (uVar1 & 4) == 0;
    elements(this,bVar9);
    iVar4 = internal::SooRep::size(&this->soo_rep_,bVar9);
    if ((iVar4 != iVar3 + -1) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,iVar3 + -1);
    return;
  }
  pLVar8 = &local_30;
  RemoveLast();
  uVar1 = pLVar8->elements_int;
  pRStack_58 = this;
  iVar3 = internal::SooRep::size((SooRep *)pLVar8,(uVar1 & 4) == 0);
  if (iVar3 < 1) {
    this_00 = (LongSooRep *)
              absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((long)iVar3,0,"old_size > 0");
  }
  else {
    this_00 = (LongSooRep *)0x0;
  }
  if (this_00 == (LongSooRep *)0x0) {
    bVar9 = (uVar1 & 4) == 0;
    RepeatedField<bool>::elements((RepeatedField<bool> *)pLVar8,bVar9);
    iVar4 = internal::SooRep::size((SooRep *)pLVar8,bVar9);
    if ((iVar4 != iVar3 + -1) && ((pLVar8->elements_int & 4) != 0)) {
      internal::LongSooRep::elements(pLVar8);
    }
    RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar8,(uVar1 & 4) == 0,iVar3 + -1);
    return;
  }
  pLVar8 = &LStack_68;
  RepeatedField<bool>::RemoveLast();
  if (this_00 == pLVar8) {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (this_00,pLVar8,"&other != this");
  }
  else {
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    uVar1 = this_00->elements_int;
    iVar3 = internal::SooRep::size((SooRep *)this_00,(uVar1 & 4) == 0);
    if (iVar3 != 0) {
      iVar4 = internal::SooRep::size((SooRep *)pLVar8,(pLVar8->elements_int & 4) == 0);
      iVar4 = iVar4 + iVar3;
      RepeatedField<int>::Reserve((RepeatedField<int> *)pLVar8,iVar4);
      uVar2 = pLVar8->elements_int;
      bVar9 = (uVar2 & 4) == 0;
      piVar6 = RepeatedField<int>::elements((RepeatedField<int> *)pLVar8,bVar9);
      iVar5 = internal::SooRep::size((SooRep *)pLVar8,bVar9);
      if ((iVar5 != iVar4) && ((pLVar8->elements_int & 4) != 0)) {
        internal::LongSooRep::elements(pLVar8);
      }
      RepeatedField<int>::set_size((RepeatedField<int> *)pLVar8,(uVar2 & 4) == 0,iVar4);
      __src = RepeatedField<int>::elements((RepeatedField<int> *)this_00,(uVar1 & 4) == 0);
      memcpy(piVar6 + iVar5,__src,(long)iVar3 << 2);
      return;
    }
    return;
  }
  RepeatedField<int>::MergeFrom();
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}